

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.cc
# Opt level: O2

string * __thiscall
iqxmlrpc::dump_response_abi_cxx11_(string *__return_storage_ptr__,iqxmlrpc *this,Response *response)

{
  Value *this_00;
  Struct *this_01;
  XmlBuilder writer;
  Node param;
  Node fault_node;
  Node root;
  Value_type_to_xml value_xml_visitor;
  Node params;
  allocator<char> local_d9;
  Value local_d8;
  undefined1 local_c8 [16];
  string local_b8;
  undefined1 local_98 [16];
  Value_type_visitor local_88;
  _Base_ptr local_80;
  undefined1 local_78;
  Struct local_70;
  string local_38;
  
  XmlBuilder::XmlBuilder((XmlBuilder *)local_c8);
  XmlBuilder::Node::Node((Node *)(local_98 + 8),(XmlBuilder *)local_c8,"methodResponse");
  local_88._vptr_Value_type_visitor = (_func_int **)&PTR__Value_type_visitor_0019f250;
  local_78 = 1;
  local_80 = (_Base_ptr)local_c8;
  if (*(long *)this == 0) {
    XmlBuilder::Node::Node((Node *)local_98,(XmlBuilder *)local_c8,"fault");
    local_70.values._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_70.values._M_t._M_impl.super__Rb_tree_header._M_header;
    local_70.super_Value_type._vptr_Value_type = (_func_int **)&PTR__Struct_0019ef70;
    local_70.values._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_70.values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_70.values._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_70.values._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_70.values._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_c8 + 0x10),"faultCode",&local_d9);
    Value::Value(&local_d8,*(int *)(this + 0x10));
    Struct::insert(&local_70,(string *)(local_c8 + 0x10),&local_d8);
    Value::~Value(&local_d8);
    std::__cxx11::string::~string((string *)(local_c8 + 0x10));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_c8 + 0x10),"faultString",&local_d9);
    std::__cxx11::string::string((string *)&local_38,(string *)(this + 0x18));
    Value::Value(&local_d8,&local_38);
    Struct::insert(&local_70,(string *)(local_c8 + 0x10),&local_d8);
    Value::~Value(&local_d8);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)(local_c8 + 0x10));
    Value::Value((Value *)(local_c8 + 0x10),&local_70);
    Value::apply_visitor((Value *)(local_c8 + 0x10),&local_88);
    Value::~Value((Value *)(local_c8 + 0x10));
    Struct::~Struct(&local_70);
    this_01 = (Struct *)local_98;
  }
  else {
    XmlBuilder::Node::Node((Node *)&local_70,(XmlBuilder *)local_c8,"params");
    XmlBuilder::Node::Node((Node *)(local_c8 + 0x10),(XmlBuilder *)local_c8,"param");
    this_00 = Response::value((Response *)this);
    Value::apply_visitor(this_00,&local_88);
    XmlBuilder::Node::~Node((Node *)(local_c8 + 0x10));
    this_01 = &local_70;
  }
  XmlBuilder::Node::~Node((Node *)this_01);
  XmlBuilder::stop((XmlBuilder *)local_c8);
  XmlBuilder::content_abi_cxx11_(__return_storage_ptr__,(XmlBuilder *)local_c8);
  XmlBuilder::Node::~Node((Node *)(local_98 + 8));
  XmlBuilder::~XmlBuilder((XmlBuilder *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

std::string
dump_response( const Response& response )
{
  XmlBuilder writer;
  XmlBuilder::Node root(writer, "methodResponse");
  Value_type_to_xml value_xml_visitor(writer, true);

  if (!response.is_fault()) {
    XmlBuilder::Node params(writer, "params");
    XmlBuilder::Node param(writer, "param");
    response.value().apply_visitor(value_xml_visitor);
  } else {
    XmlBuilder::Node fault_node(writer, "fault");
    Struct fault;
    fault.insert( "faultCode", response.fault_code() );
    fault.insert( "faultString", response.fault_string() );
    Value(fault).apply_visitor(value_xml_visitor);
  }

  writer.stop();
  return writer.content();
}